

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O0

void __thiscall
density::detail::LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false>::~LifoArrayImpl
          (LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false> *this)

{
  TestObject<1UL,_1UL> *i_block;
  size_t i_size;
  LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false> *this_local;
  
  i_block = this->m_elements;
  i_size = compute_mem_size(this->m_size);
  ThreadLifoAllocator<0>::deallocate(i_block,i_size);
  return;
}

Assistant:

~LifoArrayImpl()
            {
                detail::ThreadLifoAllocator<>::deallocate(m_elements, compute_mem_size(m_size));
            }